

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::GetFullNameInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *outPrefix,
          string *outBase,string *outSuffix)

{
  cmMakefile *pcVar1;
  bool bVar2;
  TargetType TVar3;
  char *pcVar4;
  char *pcVar5;
  char *__lhs;
  char *__lhs_00;
  ArtifactType artifact_00;
  string *psVar6;
  allocator local_e1;
  string ll;
  string fw_prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  char *local_80;
  string *local_78;
  string *local_70;
  string *local_68;
  ArtifactType local_60;
  ArtifactType local_5c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string *local_38;
  
  TVar3 = this->Target->TargetTypeValue;
  if (MODULE_LIBRARY < TVar3) {
    std::__cxx11::string::assign((char *)outPrefix);
    std::__cxx11::string::_M_assign((string *)outBase);
    std::__cxx11::string::assign((char *)outSuffix);
    return;
  }
  local_78 = config;
  local_70 = outBase;
  if (artifact == ImportLibraryArtifact) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&ll,"CMAKE_IMPORT_LIBRARY_SUFFIX",(allocator *)&fw_prefix);
    pcVar4 = cmMakefile::GetDefinition(pcVar1,&ll);
    std::__cxx11::string::~string((string *)&ll);
    if (pcVar4 == (char *)0x0) {
      std::__cxx11::string::assign((char *)outPrefix);
      std::__cxx11::string::assign((char *)local_70);
      std::__cxx11::string::assign((char *)outSuffix);
      return;
    }
    TVar3 = this->Target->TargetTypeValue;
  }
  artifact_00 = RuntimeBinaryArtifact;
  if ((TVar3 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
    artifact_00 = artifact;
  }
  if (TVar3 == EXECUTABLE) {
    artifact_00 = artifact;
  }
  local_60 = artifact;
  if (artifact == ImportLibraryArtifact) {
    std::__cxx11::string::string((string *)&ll,"IMPORT_PREFIX",(allocator *)&fw_prefix);
    pcVar5 = GetProperty(this,&ll);
    std::__cxx11::string::~string((string *)&ll);
    std::__cxx11::string::string((string *)&ll,"IMPORT_SUFFIX",(allocator *)&fw_prefix);
    pcVar4 = GetProperty(this,&ll);
  }
  else {
    std::__cxx11::string::string((string *)&ll,"PREFIX",(allocator *)&fw_prefix);
    pcVar5 = GetProperty(this,&ll);
    std::__cxx11::string::~string((string *)&ll);
    std::__cxx11::string::string((string *)&ll,"SUFFIX",(allocator *)&fw_prefix);
    pcVar4 = GetProperty(this,&ll);
  }
  std::__cxx11::string::~string((string *)&ll);
  local_68 = outPrefix;
  local_38 = outSuffix;
  if (local_78->_M_string_length == 0) {
    local_80 = (char *)0x0;
  }
  else {
    cmsys::SystemTools::UpperCase(&ll,local_78);
    std::__cxx11::string::append((char *)&ll);
    local_80 = GetProperty(this,&ll);
    if (((local_80 == (char *)0x0) || (bVar2 = IsAppBundleOnApple(this), bVar2)) ||
       (bVar2 = IsFrameworkOnApple(this), bVar2)) {
      local_80 = (char *)0x0;
    }
    std::__cxx11::string::~string((string *)&ll);
  }
  __lhs = cmTarget::GetPrefixVariableInternal(this->Target,artifact_00);
  local_5c = artifact_00;
  __lhs_00 = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
  GetLinkerLanguage(&ll,this,local_78);
  psVar6 = local_68;
  if (ll._M_string_length != 0) {
    if ((pcVar4 == (char *)0x0) && (__lhs_00 != (char *)0x0)) {
      if (*__lhs_00 == '\0') {
        pcVar4 = (char *)0x0;
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"_",&local_e1);
        std::operator+(&local_a0,__lhs_00,&local_58);
        std::operator+(&fw_prefix,&local_a0,&ll);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_58);
        pcVar4 = cmMakefile::GetDefinition(this->Makefile,&fw_prefix);
        std::__cxx11::string::~string((string *)&fw_prefix);
      }
    }
    if ((pcVar5 == (char *)0x0) && (__lhs != (char *)0x0)) {
      if (*__lhs == '\0') {
        pcVar5 = (char *)0x0;
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"_",&local_e1);
        std::operator+(&local_a0,__lhs,&local_58);
        std::operator+(&fw_prefix,&local_a0,&ll);
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_58);
        pcVar5 = cmMakefile::GetDefinition(this->Makefile,&fw_prefix);
        std::__cxx11::string::~string((string *)&fw_prefix);
      }
    }
  }
  if ((__lhs != (char *)0x0) && (pcVar5 == (char *)0x0)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&fw_prefix,__lhs,(allocator *)&local_a0);
    cmMakefile::GetSafeDefinition(pcVar1,&fw_prefix);
    std::__cxx11::string::~string((string *)&fw_prefix);
  }
  if ((__lhs_00 != (char *)0x0) && (pcVar4 == (char *)0x0)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string((string *)&fw_prefix,__lhs_00,(allocator *)&local_a0);
    cmMakefile::GetSafeDefinition(pcVar1,&fw_prefix);
    std::__cxx11::string::~string((string *)&fw_prefix);
  }
  fw_prefix._M_dataplus._M_p = (pointer)&fw_prefix.field_2;
  fw_prefix._M_string_length = 0;
  fw_prefix.field_2._M_local_buf[0] = '\0';
  bVar2 = IsFrameworkOnApple(this);
  if (bVar2) {
    GetFrameworkDirectory(&local_a0,this,local_78,ContentLevel);
    std::__cxx11::string::operator=((string *)&fw_prefix,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::append((char *)&fw_prefix);
    psVar6 = local_68;
  }
  bVar2 = IsCFBundleOnApple(this);
  if (bVar2) {
    GetCFBundleDirectory(&local_a0,this,local_78,FullLevel);
    std::__cxx11::string::operator=((string *)&fw_prefix,(string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::append((char *)&fw_prefix);
    psVar6 = local_68;
  }
  std::__cxx11::string::assign((char *)psVar6);
  GetOutputName(&local_a0,this,local_78,local_5c);
  psVar6 = local_70;
  std::__cxx11::string::append((string *)local_70);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::append((char *)psVar6);
  std::__cxx11::string::string((string *)&local_a0,"SOVERSION",(allocator *)&local_58);
  pcVar4 = GetProperty(this,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  if (((pcVar4 != (char *)0x0) && (local_60 != ImportLibraryArtifact)) &&
     (this->Target->TargetTypeValue == SHARED_LIBRARY)) {
    pcVar1 = this->Makefile;
    std::__cxx11::string::string
              ((string *)&local_a0,"CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION",(allocator *)&local_58);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    if (bVar2) {
      std::__cxx11::string::append((char *)local_70);
      std::__cxx11::string::append((char *)local_70);
    }
  }
  std::__cxx11::string::assign((char *)local_38);
  std::__cxx11::string::~string((string *)&fw_prefix);
  std::__cxx11::string::~string((string *)&ll);
  return;
}

Assistant:

void cmGeneratorTarget::GetFullNameInternal(
  const std::string& config, cmStateEnums::ArtifactType artifact,
  std::string& outPrefix, std::string& outBase, std::string& outSuffix) const
{
  // Use just the target name for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    outPrefix = "";
    outBase = this->GetName();
    outSuffix = "";
    return;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty name for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact &&
      !this->Makefile->GetDefinition("CMAKE_IMPORT_LIBRARY_SUFFIX")) {
    outPrefix = "";
    outBase = "";
    outSuffix = "";
    return;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute the full name for main target types.
  const char* targetPrefix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_PREFIX")
                               : this->GetProperty("PREFIX"));
  const char* targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));
  const char* configPostfix = CM_NULLPTR;
  if (!config.empty()) {
    std::string configProp = cmSystemTools::UpperCase(config);
    configProp += "_POSTFIX";
    configPostfix = this->GetProperty(configProp);
    // Mac application bundles and frameworks have no postfix.
    if (configPostfix &&
        (this->IsAppBundleOnApple() || this->IsFrameworkOnApple())) {
      configPostfix = CM_NULLPTR;
    }
  }
  const char* prefixVar = this->Target->GetPrefixVariableInternal(artifact);
  const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);

  // Check for language-specific default prefix and suffix.
  std::string ll = this->GetLinkerLanguage(config);
  if (!ll.empty()) {
    if (!targetSuffix && suffixVar && *suffixVar) {
      std::string langSuff = suffixVar + std::string("_") + ll;
      targetSuffix = this->Makefile->GetDefinition(langSuff);
    }
    if (!targetPrefix && prefixVar && *prefixVar) {
      std::string langPrefix = prefixVar + std::string("_") + ll;
      targetPrefix = this->Makefile->GetDefinition(langPrefix);
    }
  }

  // if there is no prefix on the target use the cmake definition
  if (!targetPrefix && prefixVar) {
    targetPrefix = this->Makefile->GetSafeDefinition(prefixVar);
  }
  // if there is no suffix on the target use the cmake definition
  if (!targetSuffix && suffixVar) {
    targetSuffix = this->Makefile->GetSafeDefinition(suffixVar);
  }

  // frameworks have directory prefix but no suffix
  std::string fw_prefix;
  if (this->IsFrameworkOnApple()) {
    fw_prefix = this->GetFrameworkDirectory(config, ContentLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = CM_NULLPTR;
  }

  if (this->IsCFBundleOnApple()) {
    fw_prefix = this->GetCFBundleDirectory(config, FullLevel);
    fw_prefix += "/";
    targetPrefix = fw_prefix.c_str();
    targetSuffix = CM_NULLPTR;
  }

  // Begin the final name with the prefix.
  outPrefix = targetPrefix ? targetPrefix : "";

  // Append the target name or property-specified name.
  outBase += this->GetOutputName(config, artifact);

  // Append the per-configuration postfix.
  outBase += configPostfix ? configPostfix : "";

  // Name shared libraries with their version number on some platforms.
  if (const char* soversion = this->GetProperty("SOVERSION")) {
    if (this->GetType() == cmStateEnums::SHARED_LIBRARY &&
        !isImportedLibraryArtifact &&
        this->Makefile->IsOn("CMAKE_SHARED_LIBRARY_NAME_WITH_VERSION")) {
      outBase += "-";
      outBase += soversion;
    }
  }

  // Append the suffix.
  outSuffix = targetSuffix ? targetSuffix : "";
}